

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O2

void __thiscall
draco::RAnsSymbolEncoder<18>::StartEncoding(RAnsSymbolEncoder<18> *this,EncoderBuffer *buffer)

{
  uint64_t uVar1;
  
  uVar1 = (long)(buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  this->buffer_offset_ = uVar1;
  EncoderBuffer::Resize(buffer,(this->num_expected_bits_ * 2 + 0x27 >> 3) + uVar1 + 8);
  (this->ans_).ans_.buf =
       (uint8_t *)
       ((buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start + this->buffer_offset_);
  (this->ans_).ans_.buf_offset = 0;
  (this->ans_).ans_.state = 0x400000;
  return;
}

Assistant:

void RAnsSymbolEncoder<unique_symbols_bit_length_t>::StartEncoding(
    EncoderBuffer *buffer) {
  // Allocate extra storage just in case.
  const uint64_t required_bits = 2 * num_expected_bits_ + 32;

  buffer_offset_ = buffer->size();
  const int64_t required_bytes = (required_bits + 7) / 8;
  buffer->Resize(buffer_offset_ + required_bytes + sizeof(buffer_offset_));
  uint8_t *const data =
      reinterpret_cast<uint8_t *>(const_cast<char *>(buffer->data()));
  ans_.write_init(data + buffer_offset_);
}